

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

size_t __thiscall
andres::
BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
::dimension(BinaryViewExpressionScalarFirst<andres::View<int,_false,_std::allocator<unsigned_long>_>,_int,_int,_andres::marray_detail::Times<int,_int,_int>_>
            *this)

{
  size_t sVar1;
  
  sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::dimension(this->e_);
  return sVar1;
}

Assistant:

const std::size_t dimension() const 
        { return e_.dimension(); }